

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O3

void __thiscall xe::TestResultParser::~TestResultParser(TestResultParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer ppIVar3;
  
  pcVar2 = (this->m_curNumValue)._M_dataplus._M_p;
  paVar1 = &(this->m_curNumValue).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  ppIVar3 = (this->m_itemStack).super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppIVar3 != (pointer)0x0) {
    operator_delete(ppIVar3,(long)(this->m_itemStack).
                                  super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppIVar3
                   );
  }
  xml::Parser::~Parser(&this->m_xmlParser);
  return;
}

Assistant:

TestResultParser::~TestResultParser (void)
{
}